

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZHelp.cpp
# Opt level: O2

string * CZHelp::rtrim_copy(string *__return_storage_ptr__,string *s)

{
  rtrim((CZHelp *)s,s);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string CZHelp::rtrim_copy(std::string s) {
    rtrim(s);
    return s;
}